

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_3879a::LoggingFileSystem::remove(LoggingFileSystem *this,char *__filename)

{
  undefined4 extraout_EAX;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->deletedPathsMutex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->deletedPaths,(value_type *)__filename);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return CONCAT31((int3)((uint)extraout_EAX >> 8),1);
}

Assistant:

virtual bool remove(const std::string& path) override {
    std::unique_lock<std::mutex> lock(deletedPathsMutex);
    deletedPaths.push_back(path);
    return true;
  }